

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_alter_aux(wchar_t dir)

{
  _Bool _Var1;
  object *obj;
  object *obj_00;
  square_conflict *psVar2;
  object *o_chest_trapped;
  object *o_chest_closed;
  _Bool more;
  loc_conflict grid;
  wchar_t dir_local;
  
  o_chest_closed._3_1_ = false;
  grid.x = dir;
  register0x00000000 = (loc_conflict)loc_sum(player->grid,ddgrid[dir]);
  player->upkeep->energy_use = (uint)z_info->move_energy;
  _Var1 = player_confuse_dir(player,&grid.x,false);
  if (_Var1) {
    register0x00000000 = (loc_conflict)loc_sum(player->grid,ddgrid[grid.x]);
  }
  obj = chest_check(player,stack0xffffffffffffffec,CHEST_OPENABLE);
  obj_00 = chest_check(player,stack0xffffffffffffffec,CHEST_TRAPPED);
  psVar2 = square((chunk *)cave,stack0xffffffffffffffec);
  if (psVar2->mon < 1) {
    _Var1 = square_isdiggable((chunk *)cave,stack0xffffffffffffffec);
    if (_Var1) {
      o_chest_closed._3_1_ = do_cmd_tunnel_aux(stack0xffffffffffffffec);
    }
    else {
      _Var1 = square_iscloseddoor((chunk *)cave,stack0xffffffffffffffec);
      if (_Var1) {
        o_chest_closed._3_1_ = do_cmd_open_aux(stack0xffffffffffffffec);
      }
      else {
        _Var1 = square_isbasicmonstertrap((chunk *)cave,stack0xffffffffffffffec);
        if (_Var1) {
          modify_monster_trap(stack0xffffffffffffffec);
        }
        else {
          _Var1 = square_isdisarmabletrap((chunk *)cave,stack0xffffffffffffffec);
          if ((_Var1) ||
             (_Var1 = square_isadvancedmonstertrap((chunk *)cave,stack0xffffffffffffffec), _Var1)) {
            o_chest_closed._3_1_ = do_cmd_disarm_aux(stack0xffffffffffffffec);
          }
          else {
            _Var1 = flag_has_dbg((player->state).pflags,10,0x2f,"player->state.pflags","(PF_TRAP)");
            if ((_Var1) &&
               (_Var1 = square_istrappable((chunk *)cave,stack0xffffffffffffffec), _Var1)) {
              do_cmd_set_trap(stack0xffffffffffffffec);
            }
            else if (obj_00 == (object *)0x0) {
              if (obj == (object *)0x0) {
                _Var1 = square_isopendoor((chunk *)cave,stack0xffffffffffffffec);
                if (_Var1) {
                  o_chest_closed._3_1_ = do_cmd_close_aux(stack0xffffffffffffffec);
                }
                else {
                  msg("You spin around.");
                }
              }
              else {
                o_chest_closed._3_1_ = do_cmd_open_chest(stack0xffffffffffffffec,obj);
              }
            }
            else {
              o_chest_closed._3_1_ = do_cmd_disarm_chest(obj_00);
            }
          }
        }
      }
    }
  }
  else {
    py_attack(player,stack0xffffffffffffffec);
  }
  if (o_chest_closed._3_1_ == false) {
    disturb(player);
  }
  return;
}

Assistant:

static void do_cmd_alter_aux(int dir)
{
	struct loc grid;
	bool more = false;
	struct object *o_chest_closed;
	struct object *o_chest_trapped;

	/* Get location */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);
	}

	/* Check for closed chest */
	o_chest_closed = chest_check(player, grid, CHEST_OPENABLE);
	/* Check for trapped chest */
	o_chest_trapped = chest_check(player, grid, CHEST_TRAPPED);

	/* Action depends on what's there */
	if (square(cave, grid)->mon > 0) {
		/* Attack monster */
		py_attack(player, grid);
	} else if (square_isdiggable(cave, grid)) {
		/* Tunnel through walls and rubble */
		more = do_cmd_tunnel_aux(grid);
	} else if (square_iscloseddoor(cave, grid)) {
		/* Open closed doors */
		more = do_cmd_open_aux(grid);
	} else if (square_isbasicmonstertrap(cave, grid)) {
		/* Modify monster traps */
		modify_monster_trap(grid);
	} else if (square_isdisarmabletrap(cave, grid) ||
			   square_isadvancedmonstertrap(cave, grid)) {
		/* Disarm traps */
		more = do_cmd_disarm_aux(grid);
	} else if (player_has(player, PF_TRAP) && square_istrappable(cave, grid)) {
		/* Set traps */
		do_cmd_set_trap(grid);
	} else if (o_chest_trapped) {
		/* Trapped chest */
		more = do_cmd_disarm_chest(o_chest_trapped);
	} else if (o_chest_closed) {
		/* Open chest */
		more = do_cmd_open_chest(grid, o_chest_closed);
	} else if (square_isopendoor(cave, grid)) {
		/* Close door */
        	more = do_cmd_close_aux(grid);
	} else {
		/* Oops */
		msg("You spin around.");
	}

	/* Cancel repetition unless we can continue */
	if (!more) disturb(player);
}